

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlinuxfbintegration.cpp
# Opt level: O3

void __thiscall QLinuxFbIntegration::initialize(QLinuxFbIntegration *this)

{
  QFbVtHandler *pQVar1;
  char cVar2;
  int iVar3;
  QPlatformInputContext *pQVar4;
  QFbVtHandler *this_00;
  QPlatformScreen *pQVar5;
  
  cVar2 = (**(code **)(*(long *)this->m_primaryScreen + 0x60))();
  if (cVar2 == '\0') {
    initialize();
  }
  else {
    pQVar5 = &this->m_primaryScreen->super_QPlatformScreen;
    if (this->m_primaryScreen == (QFbScreen *)0x0) {
      pQVar5 = (QPlatformScreen *)0x0;
    }
    QWindowSystemInterface::handleScreenAdded(pQVar5,false);
  }
  pQVar4 = (QPlatformInputContext *)QPlatformInputContextFactory::create();
  this->m_inputContext = pQVar4;
  this_00 = (QFbVtHandler *)operator_new(0x28);
  QFbVtHandler::QFbVtHandler((QFbVtHandler *)this_00,(QObject *)0x0);
  pQVar1 = (this->m_vtHandler).d;
  if ((pQVar1 != this_00) && ((this->m_vtHandler).d = this_00, pQVar1 != (QFbVtHandler *)0x0)) {
    (**(code **)(*(long *)pQVar1 + 0x20))();
  }
  iVar3 = qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT",(bool *)0x0);
  if (iVar3 == 0) {
    createInputHandlers(this);
  }
  return;
}

Assistant:

void QLinuxFbIntegration::initialize()
{
    if (m_primaryScreen->initialize())
        QWindowSystemInterface::handleScreenAdded(m_primaryScreen);
    else
        qWarning("linuxfb: Failed to initialize screen");

    m_inputContext = QPlatformInputContextFactory::create();

    m_vtHandler.reset(new QFbVtHandler);

    if (!qEnvironmentVariableIntValue("QT_QPA_FB_DISABLE_INPUT"))
        createInputHandlers();
}